

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Omega_h_build_parser.cpp
# Opt level: O0

Parser * Omega_h::accept_parser(Parser *__return_storage_ptr__,ParserInProgress *pip)

{
  bool bVar1;
  int iVar2;
  const_reference this;
  type pSVar3;
  element_type *peVar4;
  reference piVar5;
  Context *this_00;
  bool local_f9;
  iterator iStack_b0;
  int terminal;
  iterator __end4;
  iterator __begin4;
  Context *__range4;
  int local_8c;
  iterator iStack_88;
  int nt;
  reference local_80;
  ActionInProgress *action;
  iterator __end2;
  iterator __begin2;
  vector<Omega_h::ActionInProgress,_std::allocator<Omega_h::ActionInProgress>_> *__range2;
  StateInProgress *sip;
  int local_50;
  int s_i_1;
  int s_i;
  shared_ptr<const_Omega_h::Grammar> local_40;
  undefined1 local_29;
  __shared_ptr_access<const_Omega_h::Grammar,_(__gnu_cxx::_Lock_policy)2,_false,_false> *local_28;
  GrammarPtr *grammar;
  StatesInProgress *sips;
  ParserInProgress *pip_local;
  Parser *out;
  
  local_28 = (__shared_ptr_access<const_Omega_h::Grammar,_(__gnu_cxx::_Lock_policy)2,_false,_false>
              *)&pip->grammar;
  local_29 = 0;
  grammar = (GrammarPtr *)pip;
  sips = &pip->states;
  pip_local = (ParserInProgress *)__return_storage_ptr__;
  std::shared_ptr<const_Omega_h::Grammar>::shared_ptr
            (&local_40,(shared_ptr<const_Omega_h::Grammar> *)local_28);
  iVar2 = size<std::unique_ptr<Omega_h::StateInProgress,std::default_delete<Omega_h::StateInProgress>>>
                    ((vector<std::unique_ptr<Omega_h::StateInProgress,_std::default_delete<Omega_h::StateInProgress>_>,_std::allocator<std::unique_ptr<Omega_h::StateInProgress,_std::default_delete<Omega_h::StateInProgress>_>_>_>
                      *)grammar);
  Parser::Parser(__return_storage_ptr__,&local_40,iVar2);
  std::shared_ptr<const_Omega_h::Grammar>::~shared_ptr(&local_40);
  for (local_50 = 0;
      iVar2 = size<std::unique_ptr<Omega_h::StateInProgress,std::default_delete<Omega_h::StateInProgress>>>
                        ((vector<std::unique_ptr<Omega_h::StateInProgress,_std::default_delete<Omega_h::StateInProgress>_>,_std::allocator<std::unique_ptr<Omega_h::StateInProgress,_std::default_delete<Omega_h::StateInProgress>_>_>_>
                          *)grammar), local_50 < iVar2; local_50 = local_50 + 1) {
    add_state(__return_storage_ptr__);
  }
  sip._4_4_ = 0;
  do {
    iVar2 = size<std::unique_ptr<Omega_h::StateInProgress,std::default_delete<Omega_h::StateInProgress>>>
                      ((vector<std::unique_ptr<Omega_h::StateInProgress,_std::default_delete<Omega_h::StateInProgress>_>,_std::allocator<std::unique_ptr<Omega_h::StateInProgress,_std::default_delete<Omega_h::StateInProgress>_>_>_>
                        *)grammar);
    if (iVar2 <= sip._4_4_) {
      return __return_storage_ptr__;
    }
    this = at<std::unique_ptr<Omega_h::StateInProgress,std::default_delete<Omega_h::StateInProgress>>>
                     ((vector<std::unique_ptr<Omega_h::StateInProgress,_std::default_delete<Omega_h::StateInProgress>_>,_std::allocator<std::unique_ptr<Omega_h::StateInProgress,_std::default_delete<Omega_h::StateInProgress>_>_>_>
                       *)grammar,sip._4_4_);
    pSVar3 = std::
             unique_ptr<Omega_h::StateInProgress,_std::default_delete<Omega_h::StateInProgress>_>::
             operator*(this);
    __end2 = std::vector<Omega_h::ActionInProgress,_std::allocator<Omega_h::ActionInProgress>_>::
             begin(&pSVar3->actions);
    action = (ActionInProgress *)
             std::vector<Omega_h::ActionInProgress,_std::allocator<Omega_h::ActionInProgress>_>::end
                       (&pSVar3->actions);
    while (bVar1 = __gnu_cxx::operator!=
                             (&__end2,(__normal_iterator<Omega_h::ActionInProgress_*,_std::vector<Omega_h::ActionInProgress,_std::allocator<Omega_h::ActionInProgress>_>_>
                                       *)&action), bVar1) {
      local_80 = __gnu_cxx::
                 __normal_iterator<Omega_h::ActionInProgress_*,_std::vector<Omega_h::ActionInProgress,_std::allocator<Omega_h::ActionInProgress>_>_>
                 ::operator*(&__end2);
      local_f9 = false;
      if ((local_80->action).kind == ACTION_SHIFT) {
        peVar4 = std::
                 __shared_ptr_access<const_Omega_h::Grammar,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                 ::operator*(local_28);
        iStack_88 = std::set<int,_std::less<int>,_std::allocator<int>_>::begin(&local_80->context);
        piVar5 = std::_Rb_tree_const_iterator<int>::operator*(&stack0xffffffffffffff78);
        local_f9 = is_nonterminal(peVar4,*piVar5);
      }
      if (local_f9 == false) {
        this_00 = &local_80->context;
        __end4 = std::set<int,_std::less<int>,_std::allocator<int>_>::begin(this_00);
        iStack_b0 = std::set<int,_std::less<int>,_std::allocator<int>_>::end(this_00);
        while (bVar1 = std::operator!=(&__end4,&stack0xffffffffffffff50), bVar1) {
          piVar5 = std::_Rb_tree_const_iterator<int>::operator*(&__end4);
          iVar2 = *piVar5;
          peVar4 = std::
                   __shared_ptr_access<const_Omega_h::Grammar,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                   ::operator*(local_28);
          bVar1 = is_terminal(peVar4,iVar2);
          if (!bVar1) {
            fail("assertion %s failed at %s +%d\n","is_terminal(*grammar, terminal)",
                 "/workspace/llm4binary/github/license_all_cmakelists_25/gahansen[P]omega_h/src/Omega_h_build_parser.cpp"
                 ,0x465);
          }
          add_terminal_action(__return_storage_ptr__,sip._4_4_,iVar2,local_80->action);
          std::_Rb_tree_const_iterator<int>::operator++(&__end4);
        }
      }
      else {
        peVar4 = std::
                 __shared_ptr_access<const_Omega_h::Grammar,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                 ::operator*(local_28);
        __range4 = (Context *)
                   std::set<int,_std::less<int>,_std::allocator<int>_>::begin(&local_80->context);
        piVar5 = std::_Rb_tree_const_iterator<int>::operator*
                           ((_Rb_tree_const_iterator<int> *)&__range4);
        local_8c = as_nonterminal(peVar4,*piVar5);
        add_nonterminal_action
                  (__return_storage_ptr__,sip._4_4_,local_8c,(local_80->action).field_1.production);
      }
      __gnu_cxx::
      __normal_iterator<Omega_h::ActionInProgress_*,_std::vector<Omega_h::ActionInProgress,_std::allocator<Omega_h::ActionInProgress>_>_>
      ::operator++(&__end2);
    }
    sip._4_4_ = sip._4_4_ + 1;
  } while( true );
}

Assistant:

Parser accept_parser(ParserInProgress const& pip) {
  auto& sips = pip.states;
  auto& grammar = pip.grammar;
  auto out = Parser(grammar, size(sips));
  for (int s_i = 0; s_i < size(sips); ++s_i) {
    add_state(out);
  }
  for (int s_i = 0; s_i < size(sips); ++s_i) {
    auto& sip = *at(sips, s_i);
    for (auto& action : sip.actions) {
      if (action.action.kind == ACTION_SHIFT &&
          is_nonterminal(*grammar, *(action.context.begin()))) {
        auto nt = as_nonterminal(*grammar, *(action.context.begin()));
        add_nonterminal_action(out, s_i, nt, action.action.next_state);
      } else {
        for (auto terminal : action.context) {
          OMEGA_H_CHECK(is_terminal(*grammar, terminal));
          add_terminal_action(out, s_i, terminal, action.action);
        }
      }
    }
  }
  return out;
}